

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_string(command_conflict *cmd,char *arg,char **str,char *initial,char *title,
                      char *prompt)

{
  _Bool _Var1;
  wchar_t wVar2;
  char tmp [80];
  
  tmp[0x40] = '\0';
  tmp[0x41] = '\0';
  tmp[0x42] = '\0';
  tmp[0x43] = '\0';
  tmp[0x44] = '\0';
  tmp[0x45] = '\0';
  tmp[0x46] = '\0';
  tmp[0x47] = '\0';
  tmp[0x48] = '\0';
  tmp[0x49] = '\0';
  tmp[0x4a] = '\0';
  tmp[0x4b] = '\0';
  tmp[0x4c] = '\0';
  tmp[0x4d] = '\0';
  tmp[0x4e] = '\0';
  tmp[0x4f] = '\0';
  tmp[0x30] = '\0';
  tmp[0x31] = '\0';
  tmp[0x32] = '\0';
  tmp[0x33] = '\0';
  tmp[0x34] = '\0';
  tmp[0x35] = '\0';
  tmp[0x36] = '\0';
  tmp[0x37] = '\0';
  tmp[0x38] = '\0';
  tmp[0x39] = '\0';
  tmp[0x3a] = '\0';
  tmp[0x3b] = '\0';
  tmp[0x3c] = '\0';
  tmp[0x3d] = '\0';
  tmp[0x3e] = '\0';
  tmp[0x3f] = '\0';
  tmp[0x20] = '\0';
  tmp[0x21] = '\0';
  tmp[0x22] = '\0';
  tmp[0x23] = '\0';
  tmp[0x24] = '\0';
  tmp[0x25] = '\0';
  tmp[0x26] = '\0';
  tmp[0x27] = '\0';
  tmp[0x28] = '\0';
  tmp[0x29] = '\0';
  tmp[0x2a] = '\0';
  tmp[0x2b] = '\0';
  tmp[0x2c] = '\0';
  tmp[0x2d] = '\0';
  tmp[0x2e] = '\0';
  tmp[0x2f] = '\0';
  tmp[0x10] = '\0';
  tmp[0x11] = '\0';
  tmp[0x12] = '\0';
  tmp[0x13] = '\0';
  tmp[0x14] = '\0';
  tmp[0x15] = '\0';
  tmp[0x16] = '\0';
  tmp[0x17] = '\0';
  tmp[0x18] = '\0';
  tmp[0x19] = '\0';
  tmp[0x1a] = '\0';
  tmp[0x1b] = '\0';
  tmp[0x1c] = '\0';
  tmp[0x1d] = '\0';
  tmp[0x1e] = '\0';
  tmp[0x1f] = '\0';
  tmp[0] = '\0';
  tmp[1] = '\0';
  tmp[2] = '\0';
  tmp[3] = '\0';
  tmp[4] = '\0';
  tmp[5] = '\0';
  tmp[6] = '\0';
  tmp[7] = '\0';
  tmp[8] = '\0';
  tmp[9] = '\0';
  tmp[10] = '\0';
  tmp[0xb] = '\0';
  tmp[0xc] = '\0';
  tmp[0xd] = '\0';
  tmp[0xe] = '\0';
  tmp[0xf] = '\0';
  wVar2 = cmd_get_arg_string(cmd,arg,str);
  if (wVar2 == L'\0') {
LAB_0012fa9e:
    wVar2 = L'\0';
  }
  else {
    msg("%s",title);
    event_signal(EVENT_MESSAGE_FLUSH);
    if (initial != (char *)0x0) {
      my_strcpy(tmp,initial,0x50);
    }
    _Var1 = get_string(prompt,tmp,0x50);
    if (_Var1) {
      cmd_set_arg_string(cmd,arg,tmp);
      wVar2 = cmd_get_arg_string(cmd,arg,str);
      if (wVar2 == L'\0') goto LAB_0012fa9e;
    }
    wVar2 = L'\xfffffffd';
  }
  return wVar2;
}

Assistant:

int cmd_get_string(struct command *cmd, const char *arg, const char **str,
				   const char *initial, const char *title, const char *prompt)
{
	char tmp[80] = "";

	if (cmd_get_arg_string(cmd, arg, str) == CMD_OK)
		return CMD_OK;

	/* Introduce */
	msg("%s", title);
	event_signal(EVENT_MESSAGE_FLUSH);

	/* Prompt properly */
	if (initial)
		my_strcpy(tmp, initial, sizeof tmp);

	if (get_string(prompt, tmp, sizeof tmp)) {
		cmd_set_arg_string(cmd, arg, tmp);
		if (cmd_get_arg_string(cmd, arg, str) == CMD_OK)
			return CMD_OK;
	}

	return CMD_ARG_ABORTED;
}